

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O1

int __thiscall EditDistance::getMinimumDeletionCosts(EditDistance *this,IntView<0> *iVar)

{
  int iVar1;
  IntVar *pIVar2;
  int iVar3;
  IntView<0> *__range1;
  uint uVar4;
  uint uVar5;
  Tchar *pTVar6;
  
  pIVar2 = iVar->var;
  uVar4 = (pIVar2->min).v;
  if (0 < (int)uVar4) {
    iVar3 = 0x7fffffff;
    do {
      iVar1 = (this->deletion_cost).data[uVar4 - 1];
      if (iVar1 < iVar3) {
        iVar3 = iVar1;
      }
      uVar5 = 0x80000000;
      if (uVar4 != (pIVar2->max).v) {
        pTVar6 = pIVar2->vals + uVar4;
        uVar5 = uVar4;
        do {
          pTVar6 = pTVar6 + 1;
          uVar5 = uVar5 + 1;
        } while (pTVar6->v == '\0');
      }
      uVar4 = uVar5;
    } while (0 < (int)uVar5);
  }
  return 0;
}

Assistant:

iterator begin() const { return iterator(this, (type & 1) != 0 ? var->end() : var->begin()); }